

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cmprintf_group_finish_standard
               (size_t total_executed,size_t total_passed,size_t total_failed,size_t total_errors,
               size_t total_skipped,CMUnitTestState *cm_tests)

{
  long lVar1;
  int in_ECX;
  long in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  ulong in_R8;
  long in_R9;
  CMUnitTestState *cmtest_1;
  CMUnitTestState *cmtest;
  size_t i;
  ulong local_38;
  
  print_message("[==========] %u test(s) run.\n",in_RDI & 0xffffffff);
  print_error("[  PASSED  ] %u test(s).\n",in_RSI & 0xffffffff);
  if (in_R8 != 0) {
    print_error("[  SKIPPED ] %zd test(s), listed below:\n",in_R8);
    for (local_38 = 0; local_38 < in_RDI; local_38 = local_38 + 1) {
      lVar1 = in_R9 + local_38 * 0x30;
      if (*(int *)(lVar1 + 0x20) == 4) {
        print_error("[  SKIPPED ] %s\n",**(undefined8 **)(lVar1 + 8));
      }
    }
    print_error("\n %u SKIPPED TEST(S)\n",in_R8 & 0xffffffff);
  }
  if (in_RDX != 0) {
    print_error("[  FAILED  ] %zd test(s), listed below:\n",in_RDX);
    for (local_38 = 0; local_38 < in_RDI; local_38 = local_38 + 1) {
      lVar1 = in_R9 + local_38 * 0x30;
      if (*(int *)(lVar1 + 0x20) == 2) {
        print_error("[  FAILED  ] %s\n",**(undefined8 **)(lVar1 + 8));
      }
    }
    print_error("\n %u FAILED TEST(S)\n",(ulong)(uint)((int)in_RDX + in_ECX));
  }
  return;
}

Assistant:

static void cmprintf_group_finish_standard(size_t total_executed,
                                           size_t total_passed,
                                           size_t total_failed,
                                           size_t total_errors,
                                           size_t total_skipped,
                                           struct CMUnitTestState *cm_tests)
{
    size_t i;

    print_message("[==========] %u test(s) run.\n", (unsigned)total_executed);
    print_error("[  PASSED  ] %u test(s).\n",
                (unsigned)(total_passed));

    if (total_skipped) {
        print_error("[  SKIPPED ] %"PRIdS " test(s), listed below:\n", total_skipped);
        for (i = 0; i < total_executed; i++) {
            struct CMUnitTestState *cmtest = &cm_tests[i];

            if (cmtest->status == CM_TEST_SKIPPED) {
                print_error("[  SKIPPED ] %s\n", cmtest->test->name);
            }
        }
        print_error("\n %u SKIPPED TEST(S)\n", (unsigned)(total_skipped));
    }

    if (total_failed) {
        print_error("[  FAILED  ] %"PRIdS " test(s), listed below:\n", total_failed);
        for (i = 0; i < total_executed; i++) {
            struct CMUnitTestState *cmtest = &cm_tests[i];

            if (cmtest->status == CM_TEST_FAILED) {
                print_error("[  FAILED  ] %s\n", cmtest->test->name);
            }
        }
        print_error("\n %u FAILED TEST(S)\n",
                    (unsigned)(total_failed + total_errors));
    }
}